

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_builder.c
# Opt level: O3

void builder_generateCode
               (FILE *out,pattern_match_t *matches,pattern_analyse_t *analysation,_Bool returnString
               )

{
  _Bool _Var1;
  undefined7 in_register_00000009;
  size_t __size;
  char *__format;
  int __c;
  char *pcVar2;
  
  if ((int)CONCAT71(in_register_00000009,returnString) != 0) {
    if (analysation->hasFloat == true) {
      pcVar2 = 
      "__internal_hfunction->floatToString(__internal_expressionString, EXPR_STRING_LENGTH, ";
      __size = 0x55;
    }
    else {
      if ((analysation->hasInt == false) && (analysation->hasEquation != true)) goto LAB_0010581e;
      pcVar2 = "__internal_hfunction->intToString(__internal_expressionString, EXPR_STRING_LENGTH, "
      ;
      __size = 0x53;
    }
    fwrite(pcVar2,__size,1,(FILE *)out);
  }
LAB_0010581e:
  if (matches != (pattern_match_t *)0x0) {
    do {
      switch(matches->type) {
      case INT:
      case FLOAT:
      case OPERATOR:
        pcVar2 = matches->string;
        goto LAB_0010584f;
      case STRING:
        _Var1 = builder_buildStringCompare(out,matches);
        if (!_Var1) {
          pcVar2 = matches->string;
          __format = "\"%s\"";
          goto LAB_001058f6;
        }
LAB_00105880:
        matches = matches->next->next;
        break;
      case VARIABLE:
        if (analysation->hasFloat == false) {
          if (analysation->hasInt == false) {
            if (analysation->hasOperator != false) break;
            _Var1 = builder_buildStringCompare(out,matches);
            if (_Var1) goto LAB_00105880;
            pcVar2 = matches->string;
            __format = "getVariable(__internal_mfunction, __internal_root, \"%s\")";
          }
          else {
            pcVar2 = matches->string;
            __format = "atol(getVariable(__internal_mfunction, __internal_root, \"%s\"))";
          }
        }
        else {
          pcVar2 = matches->string;
          __format = "atof(getVariable(__internal_mfunction, __internal_root, \"%s\"))";
        }
LAB_001058f6:
        fprintf((FILE *)out,__format,pcVar2);
        break;
      case EQUATION:
        pcVar2 = matches->string;
        if (*pcVar2 == 'n') {
          if (pcVar2[1] == 'e') {
            pcVar2 = "!=";
            goto LAB_0010591a;
          }
        }
        else if ((*pcVar2 == 'e') && (pcVar2[1] == 'q')) {
          pcVar2 = "==";
LAB_0010591a:
          fwrite(pcVar2,2,1,(FILE *)out);
          break;
        }
LAB_0010584f:
        fputs(pcVar2,(FILE *)out);
        break;
      case POPEN:
        __c = 0x28;
        goto LAB_001058c9;
      case PCLOSE:
        __c = 0x29;
        goto LAB_001058c9;
      case NOT:
        __c = 0x21;
LAB_001058c9:
        fputc(__c,(FILE *)out);
      }
      matches = matches->next;
    } while (matches != (s_pattern_match *)0x0);
  }
  if ((returnString) &&
     (((analysation->hasFloat != false || (analysation->hasInt != false)) ||
      (analysation->hasEquation == true)))) {
    fputc(0x29,(FILE *)out);
    return;
  }
  return;
}

Assistant:

void builder_generateCode(FILE *out, pattern_match_t *matches, pattern_analyse_t *analysation, bool returnString) {

	if ( returnString ) {
		if ( analysation->hasFloat ) {
			fprintf(out, "__internal_hfunction->floatToString(__internal_expressionString, EXPR_STRING_LENGTH, ");
		} else if ( analysation->hasInt || analysation->hasEquation ) {
			fprintf(out, "__internal_hfunction->intToString(__internal_expressionString, EXPR_STRING_LENGTH, ");
		}
	}

	while ( matches != NULL ) {
		if ( matches->type == VARIABLE ) {
			matches = builder_buildVariable(out, matches, analysation);
		} else if ( matches->type == STRING ) {
			if ( builder_buildStringCompare(out, matches) ) {
				matches = matches->next->next;
			} else {
				fprintf(out, "\"%s\"", matches->string);
			}
		} else if ( matches->type == EQUATION ) {
			if ( !strncmp(matches->string, "eq", 2) ) {
				fprintf(out, "==");
			} else if ( !strncmp(matches->string, "ne", 2) ) {
				fprintf(out, "!=");
			} else {
				fprintf(out, "%s", matches->string);
			}
		} else if ( matches->type == INT ) {
			fprintf(out, "%s", matches->string);
		} else if ( matches->type == FLOAT ) {
			fprintf(out, "%s", matches->string);
		} else if ( matches->type == OPERATOR ) {
			fprintf(out, "%s", matches->string);
		} else if ( matches->type == POPEN ) {
			fprintf(out, "(");
		} else if ( matches->type == PCLOSE ) {
			fprintf(out, ")");
		} else if ( matches->type == NOT ) {
			fprintf(out, "!");
		}

		matches = matches->next;
	}

	if ( returnString ) {
		if ( analysation->hasFloat ) {
			fprintf(out, ")");
		} else if ( analysation->hasInt || analysation->hasEquation ) {
			fprintf(out, ")");
		}
	}
}